

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O0

WeierstrassCurve * ecc_weierstrass_curve(mp_int *p,mp_int *a,mp_int *b,mp_int *nonsquare_mod_p)

{
  WeierstrassCurve *pWVar1;
  mp_int *pmVar2;
  MontyContext *pMVar3;
  ModsqrtContext *pMVar4;
  WeierstrassCurve *wc;
  mp_int *nonsquare_mod_p_local;
  mp_int *b_local;
  mp_int *a_local;
  mp_int *p_local;
  
  pWVar1 = (WeierstrassCurve *)safemalloc(1,0x28,0);
  pmVar2 = mp_copy(p);
  pWVar1->p = pmVar2;
  pMVar3 = monty_new(p);
  pWVar1->mc = pMVar3;
  pmVar2 = monty_import(pWVar1->mc,a);
  pWVar1->a = pmVar2;
  pmVar2 = monty_import(pWVar1->mc,b);
  pWVar1->b = pmVar2;
  if (nonsquare_mod_p == (mp_int *)0x0) {
    pWVar1->sc = (ModsqrtContext *)0x0;
  }
  else {
    pMVar4 = modsqrt_new(p,nonsquare_mod_p);
    pWVar1->sc = pMVar4;
  }
  return pWVar1;
}

Assistant:

WeierstrassCurve *ecc_weierstrass_curve(
    mp_int *p, mp_int *a, mp_int *b, mp_int *nonsquare_mod_p)
{
    WeierstrassCurve *wc = snew(WeierstrassCurve);
    wc->p = mp_copy(p);
    wc->mc = monty_new(p);
    wc->a = monty_import(wc->mc, a);
    wc->b = monty_import(wc->mc, b);

    if (nonsquare_mod_p)
        wc->sc = modsqrt_new(p, nonsquare_mod_p);
    else
        wc->sc = NULL;

    return wc;
}